

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidPadding(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  PaddingLayerParams *this_01;
  BorderAmounts *pBVar6;
  ostream *poVar7;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_padding(this_00);
  pBVar6 = CoreML::Specification::PaddingLayerParams::mutable_paddingamounts(this_01);
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::Add
            (&pBVar6->borderamounts_);
  pBVar6 = CoreML::Specification::PaddingLayerParams::mutable_paddingamounts(this_01);
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::Add
            (&pBVar6->borderamounts_);
  CoreML::Specification::PaddingLayerParams::mutable_constant(this_01);
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xba5);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)!bVar1;
}

Assistant:

int testValidPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *paddingLayer = nn->add_layers();
    paddingLayer->add_input("input");
    paddingLayer->add_output("probs");
    auto *params = paddingLayer->mutable_padding();

    // If border amounts set, they need to be set in both directions
    params->mutable_paddingamounts()->add_borderamounts();
    params->mutable_paddingamounts()->add_borderamounts();

    (void)params->mutable_constant();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}